

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

int float128_is_quiet_nan_arm(float128 a,float_status *status)

{
  flag fVar1;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  float_status *status_local;
  float128 a_local;
  
  fVar1 = snan_bit_is_one(status);
  if (fVar1 == '\0') {
    local_2b = false;
    if (0xfffeffffffffffff < a.high << 1) {
      local_2c = a.low != 0 ||
                 ((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0;
      local_2b = local_2c;
    }
  }
  else {
    local_29 = false;
    local_2b = local_29;
    if ((a.high >> 0x2f & 0xffff) == 0xfffe) {
      local_2a = a.low != 0 ||
                 ((undefined1  [16])a & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0;
      local_2b = local_2a;
    }
  }
  a_local.high._5_3_ = 0;
  a_local.high._4_1_ = local_2b;
  return a_local.high._4_4_;
}

Assistant:

int float128_is_quiet_nan(float128 a, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return float128_is_any_nan(a);
#else
    if (snan_bit_is_one(status)) {
        return (((a.high >> 47) & 0xFFFF) == 0xFFFE)
            && (a.low || (a.high & 0x00007FFFFFFFFFFFULL));
    } else {
        return ((a.high << 1) >= 0xFFFF000000000000ULL)
            && (a.low || (a.high & 0x0000FFFFFFFFFFFFULL));
    }
#endif
}